

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

char16_t * QUtf8::convertToUnicode(char16_t *dst,QByteArrayView in,State *state)

{
  ulong uVar1;
  ulong uVar2;
  undefined4 uVar3;
  bool bVar4;
  ushort uVar5;
  qsizetype qVar6;
  uchar *puVar7;
  ulong *end_00;
  ulong *puVar8;
  State *in_RCX;
  char16_t *in_RDI;
  long in_FS_OFFSET;
  qsizetype newCharsToCopy;
  qsizetype remainingCharsCount;
  bool headerdone;
  uchar *end;
  qsizetype len;
  qsizetype res_1;
  uchar b;
  uchar *end_1;
  uchar *start;
  uchar n_2;
  __m128i data2_1;
  __m128i data_1;
  uint n_1;
  __m128i data2;
  __m128i data;
  ushort n;
  qptrdiff offset;
  qsizetype Step;
  size_t size_1;
  size_t size;
  uchar *begin;
  uchar *src;
  qsizetype res;
  char16_t replacement;
  uchar *nextAscii;
  uchar *src_1;
  anon_class_24_3_fad5e205 adjustToEnd;
  anon_class_32_4_99005a4f maybeFoundNonAscii;
  anon_class_1_0_00000001 process16Chars;
  uint dest_1;
  uint dest;
  uchar remainingCharsData [4];
  undefined4 in_stack_fffffffffffffba8;
  Flag in_stack_fffffffffffffbac;
  QByteArrayView *in_stack_fffffffffffffbb0;
  char16_t *offset_00;
  uchar *in_stack_fffffffffffffbc0;
  uint n_00;
  undefined7 in_stack_fffffffffffffbc8;
  undefined1 in_stack_fffffffffffffbcf;
  char16_t **in_stack_fffffffffffffbd0;
  size_t in_stack_fffffffffffffbd8;
  undefined8 local_3c8;
  undefined8 local_3b8;
  undefined8 local_398;
  undefined8 uStack_390;
  long local_368;
  bool local_339;
  byte local_2c8;
  undefined1 uStack_2c7;
  undefined1 uStack_2c6;
  undefined1 uStack_2c5;
  byte local_2a8;
  undefined1 uStack_2a7;
  undefined1 uStack_2a6;
  byte local_288;
  undefined1 uStack_287;
  undefined1 uStack_286;
  undefined1 uStack_285;
  byte bStack_284;
  undefined1 uStack_283;
  undefined1 uStack_282;
  undefined1 uStack_281;
  byte local_268;
  undefined1 uStack_267;
  undefined1 uStack_266;
  undefined1 uStack_265;
  byte bStack_264;
  undefined1 uStack_263;
  undefined1 uStack_262;
  QFlagsStorageHelper<QStringConverter::Flag,_4> local_11c;
  anon_class_32_4_3ac00d96 local_118;
  qsizetype local_f8;
  storage_type *local_f0;
  QFlagsStorageHelper<QStringConverter::Flag,_4> local_e4;
  long local_e0;
  long local_d8;
  long local_d0;
  QFlagsStorageHelper<QStringConverter::Flag,_4> local_c8;
  QFlagsStorageHelper<QStringConverter::Flag,_4> local_c4;
  uchar *local_c0;
  qsizetype local_b8;
  QFlagsStorageHelper<QStringConverter::Flag,_4> local_b0;
  char16_t local_aa;
  State *local_a8;
  char16_t *local_a0;
  QByteArrayView local_98;
  ulong *local_88;
  ulong *local_80;
  char16_t *local_78;
  QByteArrayView local_70;
  anon_class_24_3_fad5e205 local_60;
  ulong **local_48;
  char16_t **local_40;
  ulong **local_38;
  ulong **local_30;
  anon_class_1_0_00000001 local_21;
  ulong *local_20;
  undefined4 local_14;
  uint local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8 = in_RCX;
  local_a0 = in_RDI;
  qVar6 = QByteArrayView::size(&local_98);
  if (qVar6 != 0) {
    local_aa = L'�';
    local_b0.super_QFlagsStorage<QStringConverter::Flag>.i =
         (QFlagsStorage<QStringConverter::Flag>)
         QFlags<QStringConverter::Flag>::operator&
                   ((QFlags<QStringConverter::Flag> *)in_stack_fffffffffffffbb0,
                    in_stack_fffffffffffffbac);
    bVar4 = ::QFlags::operator_cast_to_bool((QFlags *)&local_b0);
    if (bVar4) {
      local_aa = L'\0';
    }
    local_b8 = -0x5555555555555556;
    local_c0 = (uchar *)QByteArrayView::data(&local_98);
    puVar7 = local_c0 + qVar6;
    local_c4.super_QFlagsStorage<QStringConverter::Flag>.i =
         (QFlagsStorage<QStringConverter::Flag>)
         QFlags<QStringConverter::Flag>::operator&
                   ((QFlags<QStringConverter::Flag> *)in_stack_fffffffffffffbb0,
                    in_stack_fffffffffffffbac);
    bVar4 = ::QFlags::operator_cast_to_bool((QFlags *)&local_c4);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      local_e4.super_QFlagsStorage<QStringConverter::Flag>.i =
           (QFlagsStorage<QStringConverter::Flag>)
           QFlags<QStringConverter::Flag>::operator&
                     ((QFlags<QStringConverter::Flag> *)in_stack_fffffffffffffbb0,
                      in_stack_fffffffffffffbac);
      bVar4 = ::QFlags::operator_cast_to_bool((QFlags *)&local_e4);
      if ((((((bVar4 ^ 0xffU) & 1) != 0) && (2 < qVar6)) && (*local_c0 == 0xef)) &&
         ((local_c0[1] == 0xbb && (local_c0[2] == 0xbf)))) {
        local_c0 = local_c0 + 3;
      }
    }
    else {
      bVar4 = true;
      if ((local_a8->internalState & 1U) == 0) {
        local_c8.super_QFlagsStorage<QStringConverter::Flag>.i =
             (QFlagsStorage<QStringConverter::Flag>)
             QFlags<QStringConverter::Flag>::operator&
                       ((QFlags<QStringConverter::Flag> *)in_stack_fffffffffffffbb0,
                        in_stack_fffffffffffffbac);
        bVar4 = ::QFlags::operator_cast_to_bool((QFlags *)&local_c8);
      }
      in_stack_fffffffffffffbcf = bVar4;
      if ((local_a8->remainingChars != 0) || (bVar4 == false)) {
        local_c = 0xaaaaaaaa;
        in_stack_fffffffffffffbd8 = local_a8->remainingChars;
        local_d0 = 4 - in_stack_fffffffffffffbd8;
        local_d8 = (long)puVar7 - (long)local_c0;
        in_stack_fffffffffffffbd0 = (char16_t **)qMin<long_long,long>(&local_d0,&local_d8);
        memset(&local_c,0,4);
        memcpy(&local_c,&local_a8->field_4,in_stack_fffffffffffffbd8);
        memcpy((void *)((long)&local_c + in_stack_fffffffffffffbd8),local_c0,
               (size_t)in_stack_fffffffffffffbd0);
        local_e0 = (long)&local_c + 1;
        local_b8 = QUtf8Functions::fromUtf8<QUtf8BaseTraits,char16_t*,unsigned_char_const*>
                             ((uchar)(in_stack_fffffffffffffbd8 >> 0x38),in_stack_fffffffffffffbd0,
                              (uchar **)
                              CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
                              in_stack_fffffffffffffbc0);
        if (local_b8 == -1) {
          local_a8->invalidChars = local_a8->invalidChars + 1;
          *local_a0 = local_aa;
          local_c0 = local_c0 + 1;
          local_a0 = local_a0 + 1;
        }
        else {
          if (local_b8 == -2) {
            local_a8->remainingChars = in_stack_fffffffffffffbd8 + (long)in_stack_fffffffffffffbd0;
            memcpy(&local_a8->field_4,&local_c,local_a8->remainingChars);
            goto LAB_0016ca40;
          }
          if ((bVar4 == false) && (local_a0[-1] == L'\xfeff')) {
            local_a0 = local_a0 + -1;
          }
        }
        local_a8->internalState = local_a8->internalState | 1;
        if (-1 < local_b8) {
          local_c0 = local_c0 + (local_b8 - in_stack_fffffffffffffbd8);
        }
      }
    }
    local_b8 = 0;
    offset_00 = local_a0;
    QByteArrayView::QByteArrayView<unsigned_char,_true>
              (in_stack_fffffffffffffbb0,
               (uchar *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
               (uchar *)0x16bf94);
    local_118.res = &local_b8;
    local_118.src = &local_c0;
    local_118.state = &local_a8;
    local_118.replacement = &local_aa;
    local_70.m_size = local_f8;
    local_70.m_data = local_f0;
    local_78 = offset_00;
    end_00 = (ulong *)QByteArrayView::data(&local_70);
    local_80 = end_00;
    qVar6 = QByteArrayView::size(&local_70);
    puVar8 = (ulong *)((long)end_00 + qVar6);
    local_88 = puVar8;
    while (local_80 < puVar8) {
      local_60.dst = &local_78;
      local_38 = &local_88;
      local_60.src = (uchar **)&local_80;
      local_21 = (anon_class_1_0_00000001)0xaa;
      local_30 = &local_20;
      local_60.end = (uchar **)&local_20;
      local_48 = (ulong **)local_60.src;
      local_40 = local_60.dst;
      local_20 = puVar8;
      if ((long)puVar8 - (long)local_80 < 0x10) {
        n_00 = (uint)((ulong)end_00 >> 0x20);
        if ((long)puVar8 - (long)local_80 < 8) {
          if ((long)puVar8 - (long)local_80 < 4) {
            local_339 = local_80 == puVar8;
            local_88 = puVar8;
          }
          else {
            local_10 = (uint)*local_80;
            uVar3 = *(undefined4 *)((long)puVar8 + -4);
            local_2a8 = (byte)local_10;
            uStack_2a7 = (undefined1)(local_10 >> 8);
            uStack_2a6 = (undefined1)(local_10 >> 0x10);
            local_3b8._0_4_ = (uint)CONCAT12(uStack_2a7,(ushort)local_2a8);
            local_3b8._0_6_ = (uint6)CONCAT14(uStack_2a6,(uint)local_3b8);
            local_3b8 = (ulong)CONCAT16((char)(local_10 >> 0x18),(uint6)local_3b8);
            *(ulong *)local_78 = local_3b8;
            local_14 = uVar3;
            if ((((local_10 >> 7 & 1) == 0 && (local_10 >> 0xf & 1) == 0) &&
                (local_10 >> 0x17 & 1) == 0) && -1 < (int)local_10) {
              local_88 = puVar8;
              simdDecodeAscii<1UL>::anon_class_24_3_fad5e205::operator()(&local_60);
              local_2c8 = (byte)uVar3;
              uStack_2c7 = (undefined1)((uint)uVar3 >> 8);
              uStack_2c6 = (undefined1)((uint)uVar3 >> 0x10);
              uStack_2c5 = (undefined1)((uint)uVar3 >> 0x18);
              local_3c8._0_4_ = (uint)CONCAT12(uStack_2c7,(ushort)local_2c8);
              local_3c8._0_6_ = (uint6)CONCAT14(uStack_2c6,(uint)local_3c8);
              local_3c8 = (ulong)CONCAT16(uStack_2c5,(uint6)local_3c8);
              *(ulong *)(local_78 + -4) = local_3c8;
              local_339 = simdDecodeAscii<1UL>::anon_class_32_4_99005a4f::operator()
                                    ((anon_class_32_4_99005a4f *)
                                     CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
                                     (uint)((ulong)end_00 >> 0x20),(qptrdiff)offset_00);
            }
            else {
              local_88 = puVar8;
              local_339 = simdDecodeAscii<1UL>::anon_class_32_4_99005a4f::operator()
                                    ((anon_class_32_4_99005a4f *)
                                     CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
                                     n_00,(qptrdiff)offset_00);
            }
          }
        }
        else {
          uVar1 = *local_80;
          uVar2 = puVar8[-1];
          local_268 = (byte)uVar1;
          uStack_267 = (undefined1)(uVar1 >> 8);
          uStack_266 = (undefined1)(uVar1 >> 0x10);
          uStack_265 = (undefined1)(uVar1 >> 0x18);
          bStack_264 = (byte)(uVar1 >> 0x20);
          uStack_263 = (undefined1)(uVar1 >> 0x28);
          uStack_262 = (undefined1)(uVar1 >> 0x30);
          *(ulong *)local_78 =
               (ulong)CONCAT16(uStack_265,
                               (uint6)CONCAT14(uStack_266,
                                               (uint)CONCAT12(uStack_267,(ushort)local_268)));
          *(ulong *)(local_78 + 4) =
               (ulong)CONCAT16((char)(uVar1 >> 0x38),
                               (uint6)CONCAT14(uStack_262,
                                               (uint)CONCAT12(uStack_263,(ushort)bStack_264)));
          if ((((((((uVar1 >> 7 & 1) == 0 && (uVar1 >> 0xf & 1) == 0) && (uVar1 >> 0x17 & 1) == 0)
                 && (uVar1 >> 0x1f & 1) == 0) && (uVar1 >> 0x27 & 1) == 0) &&
               (uVar1 >> 0x2f & 1) == 0) && (uVar1 >> 0x37 & 1) == 0) &&
              (uVar1 & 0x8000000000000000) == 0) {
            local_88 = puVar8;
            simdDecodeAscii<1UL>::anon_class_24_3_fad5e205::operator()(&local_60);
            local_288 = (byte)uVar2;
            uStack_287 = (undefined1)(uVar2 >> 8);
            uStack_286 = (undefined1)(uVar2 >> 0x10);
            uStack_285 = (undefined1)(uVar2 >> 0x18);
            bStack_284 = (byte)(uVar2 >> 0x20);
            uStack_283 = (undefined1)(uVar2 >> 0x28);
            uStack_282 = (undefined1)(uVar2 >> 0x30);
            uStack_281 = (undefined1)(uVar2 >> 0x38);
            local_398._0_4_ = (uint)CONCAT12(uStack_287,(ushort)local_288);
            local_398._0_6_ = (uint6)CONCAT14(uStack_286,(uint)local_398);
            local_398 = (ulong)CONCAT16(uStack_285,(uint6)local_398);
            uStack_390._0_4_ = (uint)CONCAT12(uStack_283,(ushort)bStack_284);
            uStack_390._0_6_ = (uint6)CONCAT14(uStack_282,(uint)uStack_390);
            uStack_390 = (ulong)CONCAT16(uStack_281,(uint6)uStack_390);
            *(ulong *)(local_78 + -8) = local_398;
            *(ulong *)(local_78 + -4) = uStack_390;
            local_339 = simdDecodeAscii<1UL>::anon_class_32_4_99005a4f::operator()
                                  ((anon_class_32_4_99005a4f *)
                                   CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
                                   (uint)((ulong)end_00 >> 0x20),(qptrdiff)offset_00);
          }
          else {
            local_88 = puVar8;
            local_339 = simdDecodeAscii<1UL>::anon_class_32_4_99005a4f::operator()
                                  ((anon_class_32_4_99005a4f *)
                                   CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
                                   n_00,(qptrdiff)offset_00);
          }
        }
      }
      else {
        local_88 = puVar8;
        for (local_368 = 0; local_368 + 0x10 < (long)local_20 - (long)local_80;
            local_368 = local_368 + 0x10) {
          uVar5 = simdDecodeAscii<1UL>::anon_class_1_0_00000001::operator()
                            (&local_21,local_78 + local_368,(uchar *)((long)local_80 + local_368));
          if (uVar5 != 0) {
            local_339 = simdDecodeAscii<1UL>::anon_class_32_4_99005a4f::operator()
                                  ((anon_class_32_4_99005a4f *)
                                   CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
                                   (uint)((ulong)end_00 >> 0x20),(qptrdiff)offset_00);
            goto LAB_0016c81d;
          }
        }
        simdDecodeAscii<1UL>::anon_class_24_3_fad5e205::operator()(&local_60);
        simdDecodeAscii<1UL>::anon_class_1_0_00000001::operator()
                  (&local_21,local_78 + -0x10,(uchar *)(local_80 + -2));
        local_339 = simdDecodeAscii<1UL>::anon_class_32_4_99005a4f::operator()
                              ((anon_class_32_4_99005a4f *)
                               CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
                               (uint)((ulong)end_00 >> 0x20),(qptrdiff)offset_00);
      }
LAB_0016c81d:
      if (local_339 != false) break;
      do {
        local_80 = (ulong *)((long)local_80 + 1);
        qVar6 = QUtf8Functions::fromUtf8<QUtf8BaseTraits,char16_t*,unsigned_char_const*>
                          ((uchar)(in_stack_fffffffffffffbd8 >> 0x38),in_stack_fffffffffffffbd0,
                           (uchar **)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
                           (uchar *)end_00);
        if ((qVar6 < 0) &&
           (bVar4 = convertToUnicode::anon_class_32_4_3ac00d96::operator()
                              (&local_118,&local_78,(uchar *)local_80,(int)qVar6), !bVar4))
        goto LAB_0016c8e8;
      } while (local_80 < local_88);
    }
LAB_0016c8e8:
    local_a0 = local_78;
    if (local_b8 == -2) {
      local_11c.super_QFlagsStorage<QStringConverter::Flag>.i =
           (QFlagsStorage<QStringConverter::Flag>)
           QFlags<QStringConverter::Flag>::operator&
                     ((QFlags<QStringConverter::Flag> *)in_stack_fffffffffffffbb0,
                      in_stack_fffffffffffffbac);
      bVar4 = ::QFlags::operator_cast_to_bool((QFlags *)&local_11c);
      if (bVar4) {
        *local_a0 = L'�';
        local_a8->invalidChars = local_a8->invalidChars + 1;
        while( true ) {
          local_a0 = local_a0 + 1;
          if (puVar7 <= local_c0) break;
          *local_a0 = L'�';
          local_a8->invalidChars = local_a8->invalidChars + 1;
          local_c0 = local_c0 + 1;
        }
        local_a8->remainingChars = 0;
        local_c0 = local_c0 + 1;
      }
      else {
        local_c0 = local_c0 + -1;
        local_a8->remainingChars = (long)puVar7 - (long)local_c0;
        memcpy(&local_a8->field_4,local_c0,(long)puVar7 - (long)local_c0);
      }
    }
    else {
      local_a8->remainingChars = 0;
    }
  }
LAB_0016ca40:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_a0;
}

Assistant:

char16_t *QUtf8::convertToUnicode(char16_t *dst, QByteArrayView in, QStringConverter::State *state)
{
    qsizetype len = in.size();

    Q_ASSERT(state);
    if (!len)
        return dst;


    char16_t replacement = QChar::ReplacementCharacter;
    if (state->flags & QStringConverter::Flag::ConvertInvalidToNull)
        replacement = QChar::Null;

    qsizetype res;

    const uchar *src = reinterpret_cast<const uchar *>(in.data());
    const uchar *end = src + len;

    if (!(state->flags & QStringConverter::Flag::Stateless)) {
        bool headerdone = state->internalState & HeaderDone || state->flags & QStringConverter::Flag::ConvertInitialBom;
        if (state->remainingChars || !headerdone) {
            // handle incoming state first
            uchar remainingCharsData[4]; // longest UTF-8 sequence possible
            qsizetype remainingCharsCount = state->remainingChars;
            qsizetype newCharsToCopy = qMin<qsizetype>(sizeof(remainingCharsData) - remainingCharsCount, end - src);

            memset(remainingCharsData, 0, sizeof(remainingCharsData));
            memcpy(remainingCharsData, &state->state_data[0], remainingCharsCount);
            memcpy(remainingCharsData + remainingCharsCount, src, newCharsToCopy);

            const uchar *begin = &remainingCharsData[1];
            res = QUtf8Functions::fromUtf8<QUtf8BaseTraits>(remainingCharsData[0], dst, begin,
                    static_cast<const uchar *>(remainingCharsData) + remainingCharsCount + newCharsToCopy);
            if (res == QUtf8BaseTraits::Error) {
                ++state->invalidChars;
                *dst++ = replacement;
                ++src;
            } else if (res == QUtf8BaseTraits::EndOfString) {
                // if we got EndOfString again, then there were too few bytes in src;
                // copy to our state and return
                state->remainingChars = remainingCharsCount + newCharsToCopy;
                memcpy(&state->state_data[0], remainingCharsData, state->remainingChars);
                return dst;
            } else if (!headerdone) {
                // eat the UTF-8 BOM
                if (dst[-1] == 0xfeff)
                    --dst;
            }
            state->internalState |= HeaderDone;

            // adjust src now that we have maybe consumed a few chars
            if (res >= 0) {
                Q_ASSERT(res > remainingCharsCount);
                src += res - remainingCharsCount;
            }
        }
    } else if (!(state->flags & QStringConverter::Flag::ConvertInitialBom)) {
        // stateless, remove initial BOM
        if (len > 2 && src[0] == utf8bom[0] && src[1] == utf8bom[1] && src[2] == utf8bom[2])
            // skip BOM
            src += 3;
    }

    // main body, stateless decoding
    res = 0;
    dst = convertToUnicode(dst, { src, end }, [&](char16_t *&dst, const uchar *src_, int res_) {
        res = res_;
        src = src_;
        if (res == QUtf8BaseTraits::Error) {
            res = 0;
            ++state->invalidChars;
            *dst++ = replacement;
        }
        return res == 0;    // continue if plain decoding error
    });

    if (res == QUtf8BaseTraits::EndOfString) {
        // unterminated UTF sequence
        if (state->flags & QStringConverter::Flag::Stateless) {
            *dst++ = QChar::ReplacementCharacter;
            ++state->invalidChars;
            while (src++ < end) {
                *dst++ = QChar::ReplacementCharacter;
                ++state->invalidChars;
            }
            state->remainingChars = 0;
        } else {
            --src; // unread the byte in ch
            state->remainingChars = end - src;
            memcpy(&state->state_data[0], src, end - src);
        }
    } else {
        state->remainingChars = 0;
    }

    return dst;
}